

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall ON_PlaneSurface::Trim(ON_PlaneSurface *this,int dir,ON_Interval *domain)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  ON_Interval *this_00;
  long lVar5;
  ON_Interval *rhs;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  ON_Interval trim_extents;
  ON_Interval trim_domain;
  ON_Interval current_domain;
  ON_Interval local_38;
  
  if (1 < (uint)dir) {
    return false;
  }
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
  current_domain.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  current_domain.m_t[1] = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  pdVar4 = ON_Interval::operator[](&current_domain,0);
  if ((*pdVar4 == -1.23432101234321e+308) && (!NAN(*pdVar4))) {
    pdVar4 = ON_Interval::operator[](&current_domain,1);
    if ((*pdVar4 == -1.23432101234321e+308) && (!NAN(*pdVar4))) {
      current_domain.m_t[0] = domain->m_t[0];
      current_domain.m_t[1] = domain->m_t[1];
    }
  }
  ON_Interval::ON_Interval(&trim_domain);
  lVar5 = (ulong)(uint)dir * 0x10;
  trim_extents.m_t[0] = *(double *)(&this->field_0xb0 + lVar5);
  trim_extents.m_t[1] = *(double *)((long)(&this->field_0xb0 + lVar5) + 8);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
            (this,(ulong)(uint)dir);
  ON_Interval::Intersection(&trim_domain,domain,&local_38);
  bVar3 = ON_Interval::IsIncreasing(&trim_domain);
  if (bVar3) {
    rhs = (ON_Interval *)(&this->field_0xb0 + lVar5);
    this_00 = (ON_Interval *)(&this->field_0x90 + lVar5);
    bVar3 = ON_Interval::operator==(this_00,rhs);
    if (bVar3) {
      trim_extents.m_t[0] = trim_domain.m_t[0];
      trim_extents.m_t[1] = trim_domain.m_t[1];
    }
    else {
      pdVar4 = ON_Interval::operator[](&trim_domain,0);
      dVar1 = ON_Interval::NormalizedParameterAt(this_00,*pdVar4);
      dVar1 = ON_Interval::ParameterAt(rhs,dVar1);
      pdVar4 = ON_Interval::operator[](&trim_domain,1);
      dVar2 = ON_Interval::NormalizedParameterAt(this_00,*pdVar4);
      dVar2 = ON_Interval::ParameterAt(rhs,dVar2);
      ON_Interval::Set(&trim_extents,dVar1,dVar2);
    }
    bVar3 = ON_Interval::IsIncreasing(&trim_extents);
    if (bVar3) {
      rhs->m_t[0] = trim_extents.m_t[0];
      *(double *)(&this->field_0xb8 + lVar5) = trim_extents.m_t[1];
      this_00->m_t[0] = trim_domain.m_t[0];
      *(double *)(&this->field_0x98 + lVar5) = trim_domain.m_t[1];
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PlaneSurface::Trim(
       int dir,
       const ON_Interval& domain
       )
{
  if ( dir < 0 || dir > 1 )
    return false;
  ON_Interval current_domain = Domain(dir);
  if ( current_domain[0] == ON_UNSET_VALUE && current_domain[1] == ON_UNSET_VALUE )
    current_domain = domain;
  ON_Interval trim_domain, trim_extents = m_extents[dir];
  trim_domain.Intersection(domain, Domain(dir) );
  if ( !trim_domain.IsIncreasing() )
    return false;
  if ( m_domain[dir] == m_extents[dir] )
    trim_extents = trim_domain;
  else
  {
    double x0 = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt( trim_domain[0] ) );
    double x1 = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt( trim_domain[1] ) );
    trim_extents.Set(x0,x1);
  }
  if ( !trim_extents.IsIncreasing() )
    return false;
  m_extents[dir] = trim_extents;
  m_domain[dir] = trim_domain;
  return true;
}